

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

_Bool ggml_thread_apply_priority(int32_t prio)

{
  FILE *__stream;
  uint __errnum;
  pthread_t __target_thread;
  char *pcVar1;
  uint in_EDI;
  int32_t err;
  int32_t policy;
  sched_param p;
  int local_10;
  sched_param local_c;
  uint local_8;
  _Bool local_1;
  
  local_10 = 0;
  switch(in_EDI) {
  case 0:
    local_10 = 0;
    local_c.__sched_priority = 0;
    break;
  case 1:
    local_10 = 1;
    local_c.__sched_priority = 0x28;
    break;
  case 2:
    local_10 = 1;
    local_c.__sched_priority = 0x50;
    break;
  case 3:
    local_10 = 1;
    local_c.__sched_priority = 0x5a;
  }
  if (in_EDI == 0) {
    local_1 = true;
  }
  else {
    local_8 = in_EDI;
    __target_thread = pthread_self();
    __errnum = pthread_setschedparam(__target_thread,local_10,&local_c);
    __stream = _stderr;
    if (__errnum == 0) {
      local_1 = true;
    }
    else {
      pcVar1 = strerror(__errnum);
      fprintf(__stream,"warn: failed to set thread priority %d : %s (%d)\n",(ulong)local_8,pcVar1,
              (ulong)__errnum);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ggml_thread_apply_priority(int32_t prio) {
    struct sched_param p;
    int32_t policy = SCHED_OTHER;
    switch (prio) {
        case GGML_SCHED_PRIO_NORMAL:   policy = SCHED_OTHER; p.sched_priority = 0;  break;
        case GGML_SCHED_PRIO_MEDIUM:   policy = SCHED_FIFO;  p.sched_priority = 40; break;
        case GGML_SCHED_PRIO_HIGH:     policy = SCHED_FIFO;  p.sched_priority = 80; break;
        case GGML_SCHED_PRIO_REALTIME: policy = SCHED_FIFO;  p.sched_priority = 90; break;
    }

    if (prio == GGML_SCHED_PRIO_NORMAL) {
        // Keep inherited policy/priority
        return true;
    }

    int32_t err = pthread_setschedparam(pthread_self(), policy, &p);
    if (err != 0) {
        fprintf(stderr, "warn: failed to set thread priority %d : %s (%d)\n", prio, strerror(err), err);
        return false;
    }

    return true;
}